

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsBrokerGlobalError(HelicsBroker broker,int errorCode,char *errorString,HelicsError *err)

{
  element_type *peVar1;
  BrokerObject *pBVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  
  pBVar2 = helics::getBrokerObject(broker,err);
  if ((pBVar2 != (BrokerObject *)0x0) &&
     (peVar1 = (pBVar2->brokerptr).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (errorString != (char *)0x0) {
      sVar3 = strlen(errorString);
      _Var4._M_p = errorString;
    }
    (*peVar1->_vptr_Broker[0x1c])(peVar1,errorCode,sVar3,_Var4._M_p);
    return;
  }
  return;
}

Assistant:

void helicsBrokerGlobalError(HelicsBroker broker, int errorCode, const char* errorString, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    brk->globalError(errorCode, AS_STRING_VIEW(errorString));
}